

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLBK.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix::verifyLBK(int LBK)

{
  undefined8 *puVar1;
  char *unaff_RBX;
  
  if (LBK == 0) {
    return;
  }
  tools::Log::error<char_const*>(unaff_RBX);
  tools::Log::info<char_const*>(unaff_RBX);
  tools::Log::info<char_const*,int>("LBK value: {}",LBK);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyLBK( int LBK ) {

  if ( LBK != 0 ) {

    Log::error( "Encountered the wrong LBK value" );
    Log::info( "Expected LBK to be equal to 0" );
    Log::info( "LBK value: {}", LBK );
    throw std::exception();
  }
}